

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

void vera::splitFacesFromVerticalRow<unsigned_char>
               (uchar *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<unsigned_char> **_faces)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  CubemapFace<unsigned_char> *pCVar4;
  uchar *puVar5;
  ulong uVar6;
  int n;
  int offset;
  CubemapFace<unsigned_char> *face;
  int iFace;
  int jFace;
  int l;
  int i;
  int faceHeight;
  int faceWidth;
  CubemapFace<unsigned_char> **_faces_local;
  size_t _channels_local;
  size_t _height_local;
  size_t _width_local;
  uchar *_data_local;
  
  iVar2 = (int)_width;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _height;
  iVar3 = SUB164(auVar1 / ZEXT816(6),0);
  for (jFace = 0; jFace < 6; jFace = jFace + 1) {
    pCVar4 = (CubemapFace<unsigned_char> *)operator_new(0x18);
    memset(pCVar4,0,0x18);
    _faces[jFace] = pCVar4;
    _faces[jFace]->id = jFace;
    uVar6 = (ulong)(iVar2 * 3 * iVar3);
    if ((long)uVar6 < 0) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (uchar *)operator_new__(uVar6);
    _faces[jFace]->data = puVar5;
    _faces[jFace]->width = iVar2;
    _faces[jFace]->height = iVar3;
    _faces[jFace]->currentOffset = 0;
  }
  for (iFace = 0; (ulong)(long)iFace < _height; iFace = iFace + 1) {
    for (face._0_4_ = 0; (int)face < 6; face._0_4_ = (int)face + 1) {
      pCVar4 = _faces[(iFace - iFace % iVar3) / iVar3];
      if (pCVar4 != (CubemapFace<unsigned_char> *)0x0) {
        memcpy(pCVar4->data + pCVar4->currentOffset,_data + (iVar2 * (int)face + iFace * iVar2) * 3,
               (long)(iVar2 * 3));
        pCVar4->currentOffset = iVar2 * 3 + pCVar4->currentOffset;
      }
    }
  }
  return;
}

Assistant:

void splitFacesFromVerticalRow(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width;
    int faceHeight = _height/6;


    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;
        for (int iFace = 0; iFace < 6; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //   0   1   2   3   4   5 j      
            //  +X  -X  +Y  -Y  +Z  -Z 
            //
            face = _faces[jFace];

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}